

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

string * disassemble_spirv_abi_cxx11_
                   (string *__return_storage_ptr__,VulkanDevice *device,VkPipeline pipeline,
                   DisasmMethod method,VkShaderStageFlagBits stage,
                   VkShaderModuleCreateInfo *module_create_info,char *entry_point)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkShaderStageFlagBits VVar2;
  pointer pVVar3;
  pointer pVVar4;
  char cVar5;
  bool bVar6;
  spvc_result sVar7;
  VkResult VVar8;
  size_type *psVar9;
  ulong uVar10;
  void *pvVar11;
  uint uVar12;
  VkPipelineExecutablePropertiesKHR *pVVar13;
  ulong uVar14;
  ulong uVar15;
  VkShaderStageFlags *pVVar16;
  SpvExecutionModel model;
  VkPipelineExecutableInternalRepresentationKHR *rep_1;
  char cVar17;
  VkPipeline pVVar18;
  VkPipelineExecutableStatisticKHR *pVVar19;
  VkPipelineExecutableStatisticKHR *stat_1;
  pointer pVVar20;
  char *pcVar21;
  VkPipelineExecutableInternalRepresentationKHR *pVVar22;
  uint uVar23;
  VkPipelineExecutableInternalRepresentationKHR *rep_2;
  spvc_parsed_ir ir;
  spvc_context ctx;
  char *output;
  vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
  statistics;
  spvc_compiler_options opts;
  spvc_compiler comp;
  uint32_t local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
  local_a8;
  vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
  local_88;
  vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
  local_70;
  VkPipelineInfoKHR local_58;
  VkPipelineExecutableStatisticKHR *local_38;
  
  if (method != ISA) {
    if (method == GLSL) {
      sVar7 = spvc_context_create((spvc_context *)local_c8);
      if (sVar7 != SPVC_SUCCESS) goto switchD_001393f2_caseD_3;
      sVar7 = spvc_context_parse_spirv
                        ((spvc_context)local_c8._0_8_,module_create_info->pCode,
                         module_create_info->codeSize >> 2,(spvc_parsed_ir *)&local_e8);
      if (((sVar7 == SPVC_SUCCESS) &&
          (sVar7 = spvc_context_create_compiler
                             ((spvc_context)local_c8._0_8_,SPVC_BACKEND_GLSL,
                              (spvc_parsed_ir)local_e8._M_dataplus._M_p,
                              SPVC_CAPTURE_MODE_TAKE_OWNERSHIP,(spvc_compiler *)&local_58),
          sVar7 == SPVC_SUCCESS)) &&
         (sVar7 = spvc_compiler_create_compiler_options
                            ((spvc_compiler)local_58._0_8_,(spvc_compiler_options *)&local_70),
         sVar7 == SPVC_SUCCESS)) {
        spvc_compiler_options_set_uint
                  ((spvc_compiler_options)
                   local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start,SPVC_COMPILER_OPTION_GLSL_VERSION,0x1cc
                  );
        model = SpvExecutionModelVertex;
        spvc_compiler_options_set_bool
                  ((spvc_compiler_options)
                   local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start,SPVC_COMPILER_OPTION_GLSL_ES,'\0');
        spvc_compiler_options_set_bool
                  ((spvc_compiler_options)
                   local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   SPVC_COMPILER_OPTION_GLSL_VULKAN_SEMANTICS,'\x01');
        spvc_compiler_install_compiler_options
                  ((spvc_compiler)local_58._0_8_,
                   (spvc_compiler_options)
                   local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (entry_point != (char *)0x0) {
          if ((int)stage < 0x80) {
            if ((int)stage < 0x10) {
              switch(stage) {
              case VK_SHADER_STAGE_VERTEX_BIT:
                break;
              case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
                model = SpvExecutionModelTessellationControl;
                break;
              default:
                goto switchD_001393f2_caseD_3;
              case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
                model = SpvExecutionModelTessellationEvaluation;
                break;
              case VK_SHADER_STAGE_GEOMETRY_BIT:
                model = SpvExecutionModelGeometry;
              }
            }
            else if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
              model = SpvExecutionModelFragment;
            }
            else if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
              model = SpvExecutionModelGLCompute;
            }
            else {
              if (stage != VK_SHADER_STAGE_TASK_BIT_EXT) goto switchD_001393f2_caseD_3;
              model = SpvExecutionModelTaskEXT;
            }
          }
          else if ((int)stage < 0x400) {
            if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
              model = SpvExecutionModelMeshEXT;
            }
            else if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
              model = SpvExecutionModelRayGenerationKHR;
            }
            else {
              if (stage != VK_SHADER_STAGE_ANY_HIT_BIT_KHR) goto switchD_001393f2_caseD_3;
              model = SpvExecutionModelAnyHitKHR;
            }
          }
          else if ((int)stage < 0x1000) {
            if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
              model = SpvExecutionModelClosestHitKHR;
            }
            else {
              if (stage != VK_SHADER_STAGE_MISS_BIT_KHR) goto switchD_001393f2_caseD_3;
              model = SpvExecutionModelMissKHR;
            }
          }
          else if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
            model = SpvExecutionModelIntersectionKHR;
          }
          else {
            if (stage != VK_SHADER_STAGE_CALLABLE_BIT_KHR) goto switchD_001393f2_caseD_3;
            model = SpvExecutionModelCallableKHR;
          }
          spvc_compiler_set_entry_point((spvc_compiler)local_58._0_8_,entry_point,model);
        }
        sVar7 = spvc_compiler_compile((spvc_compiler)local_58._0_8_,(char **)&local_a8);
        if (sVar7 == SPVC_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,
                     (char *)local_a8.
                             super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_88);
          spvc_context_destroy((spvc_context)local_c8._0_8_);
          return __return_storage_ptr__;
        }
      }
      spvc_context_destroy((spvc_context)local_c8._0_8_);
switchD_001393f2_caseD_3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x656c696146202f2f;
      *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 100;
      __return_storage_ptr__->_M_string_length = 9;
      return __return_storage_ptr__;
    }
    if (method != Asm) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    local_c8._8_8_ = (pointer)0x0;
    local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
    local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)local_b8;
    spvtools::SpirvTools::SpirvTools((SpirvTools *)&local_e8,SPV_ENV_VULKAN_1_2);
    bVar6 = spvtools::SpirvTools::Disassemble
                      ((SpirvTools *)&local_e8,module_create_info->pCode,
                       module_create_info->codeSize >> 2,(string *)local_c8,0x40);
    pVVar13 = (VkPipelineExecutablePropertiesKHR *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)pVVar13;
    if (bVar6) {
      if ((VkPipelineExecutablePropertiesKHR *)local_c8._0_8_ ==
          (VkPipelineExecutablePropertiesKHR *)local_b8) {
        *(undefined8 *)pVVar13 = local_b8._0_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8._0_8_;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._0_8_;
      }
      psVar9 = (size_type *)(local_c8 + 8);
      __return_storage_ptr__->_M_string_length = local_c8._8_8_;
      pVVar13 = (VkPipelineExecutablePropertiesKHR *)local_b8;
      local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)local_b8;
    }
    else {
      psVar9 = &__return_storage_ptr__->_M_string_length;
    }
    *psVar9 = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&pVVar13->sType)->_M_local_buf[0] = '\0';
    spvtools::SpirvTools::~SpirvTools((SpirvTools *)&local_e8);
    if ((VkPipelineExecutablePropertiesKHR *)local_c8._0_8_ ==
        (VkPipelineExecutablePropertiesKHR *)local_b8) {
      return __return_storage_ptr__;
    }
    pVVar18 = (VkPipeline)(local_b8._0_8_ + 1);
    local_70.
    super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
    goto LAB_00139bd2;
  }
  if (device->pipeline_stats == true) {
    local_ec = 0;
    local_58._0_8_ = (spvc_compiler)0x3b9ee4c9;
    local_58.pNext = (void *)0x0;
    local_58.pipeline = pipeline;
    VVar8 = (*vkGetPipelineExecutablePropertiesKHR)
                      (device->device,&local_58,&local_ec,(VkPipelineExecutablePropertiesKHR *)0x0);
    if (VVar8 != VK_SUCCESS) {
LAB_0013958a:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    std::
    vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>::
    vector(&local_70,(ulong)local_ec,(allocator_type *)local_c8);
    for (pVVar13 = local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar13 !=
        local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish; pVVar13 = pVVar13 + 1) {
      pVVar13->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_PROPERTIES_KHR;
    }
    VVar8 = (*vkGetPipelineExecutablePropertiesKHR)
                      (device->device,&local_58,&local_ec,
                       local_70.
                       super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (VVar8 != VK_SUCCESS) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto joined_r0x0013957a;
    }
    uVar14 = (ulong)local_ec;
    if (uVar14 != 0) {
      if ((*(VkShaderStageFlagBits *)
            &(local_70.
              super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
              ._M_impl.super__Vector_impl_data._M_start)->stages & stage) == 0) {
        uVar10 = 0;
        pVVar16 = &local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].stages;
        do {
          if (uVar14 - 1 == uVar10) goto LAB_00139b99;
          uVar10 = uVar10 + 1;
          VVar2 = *pVVar16;
          pVVar16 = pVVar16 + 0x86;
        } while ((VVar2 & stage) == 0);
        bVar6 = uVar10 < uVar14;
      }
      else {
        uVar10 = 0;
        bVar6 = true;
      }
      if (bVar6) {
        local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)0x3b9ee4cb;
        local_c8._8_8_ = (pointer)0x0;
        local_b8._8_8_ = uVar10 & 0xffffffff;
        local_a8.
        super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (VkPipelineExecutableInternalRepresentationKHR *)0x0;
        local_a8.
        super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (VkPipelineExecutableInternalRepresentationKHR *)0x0;
        local_a8.
        super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8._0_8_ = pipeline;
        VVar8 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                          (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                           (VkPipelineExecutableInternalRepresentationKHR *)0x0);
        if (VVar8 == VK_SUCCESS) {
          std::
          vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
          ::resize(&local_a8,(ulong)local_ec);
          for (pVVar22 = local_a8.
                         super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar22 !=
              local_a8.
              super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
              ._M_impl.super__Vector_impl_data._M_finish; pVVar22 = pVVar22 + 1) {
            pVVar22->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
          }
          VVar8 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                            (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                             local_a8.
                             super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          pVVar4 = local_a8.
                   super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pVVar3 = local_a8.
                   super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar6 = VVar8 == VK_SUCCESS;
          pVVar22 = local_a8.
                    super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar6) {
            for (; pVVar22 != pVVar4; pVVar22 = pVVar22 + 1) {
              pvVar11 = malloc(pVVar22->dataSize);
              pVVar22->pData = pvVar11;
            }
            VVar8 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                              (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                               pVVar3);
            pVVar3 = local_a8.
                     super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = VVar8 == VK_SUCCESS;
            pVVar22 = local_a8.
                      super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (bVar6) goto LAB_00139c45;
            for (; pVVar22 != pVVar3; pVVar22 = pVVar22 + 1) {
              free(pVVar22->pData);
            }
          }
          else {
LAB_00139c45:
            if (bVar6) goto LAB_0013969b;
          }
          if (local_a8.
              super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_a8.
              super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_a8.
            super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_a8.
                 super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
        }
LAB_0013969b:
        local_88.
        super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
        ._M_impl.super__Vector_impl_data._M_start = (VkPipelineExecutableStatisticKHR *)0x0;
        local_88.
        super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish = (VkPipelineExecutableStatisticKHR *)0x0;
        local_88.
        super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        VVar8 = (*vkGetPipelineExecutableStatisticsKHR)
                          (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                           (VkPipelineExecutableStatisticKHR *)0x0);
        if (VVar8 == VK_SUCCESS) {
          std::
          vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
          ::resize(&local_88,(ulong)local_ec);
          for (pVVar19 = local_88.
                         super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar19 !=
              local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_finish; pVVar19 = pVVar19 + 1) {
            pVVar19->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
          }
          VVar8 = (*vkGetPipelineExecutableStatisticsKHR)
                            (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                             local_88.
                             super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if ((VVar8 != VK_SUCCESS) &&
             (local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            local_88.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        pVVar3 = local_a8.
                 super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (local_a8.
            super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.
            super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pcVar21 = (local_a8.
                     super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start)->description;
          do {
            if (*(VkBool32 *)(pcVar21 + 0x100) != 0) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            free(*(void **)(pcVar21 + 0x110));
            pVVar22 = (VkPipelineExecutableInternalRepresentationKHR *)(pcVar21 + 0x118);
            pcVar21 = pcVar21 + 0x228;
          } while (pVVar22 != pVVar3);
        }
        if (local_88.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_88.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar1 = &local_e8.field_2;
          local_38 = local_88.
                     super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pVVar19 = local_88.
                    super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pVVar20 = local_88.
                    super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            switch(pVVar20->format) {
            case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_BOOL32_KHR:
              uVar23 = (pVVar20->value).b32;
              cVar17 = '\x01';
              if (9 < uVar23) {
                uVar12 = uVar23;
                cVar5 = '\x04';
                do {
                  cVar17 = cVar5;
                  if (uVar12 < 100) {
                    cVar17 = cVar17 + -2;
                    goto LAB_00139a48;
                  }
                  if (uVar12 < 1000) {
                    cVar17 = cVar17 + -1;
                    goto LAB_00139a48;
                  }
                  if (uVar12 < 10000) goto LAB_00139a48;
                  bVar6 = 99999 < uVar12;
                  uVar12 = uVar12 / 10000;
                  cVar5 = cVar17 + '\x04';
                } while (bVar6);
                cVar17 = cVar17 + '\x01';
              }
LAB_00139a48:
              local_e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_e8,cVar17);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_e8._M_dataplus._M_p,(uint)local_e8._M_string_length,uVar23);
              goto LAB_00139a6c;
            case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_INT64_KHR:
              uVar14 = (pVVar20->value).u64;
              uVar10 = -uVar14;
              if (0 < (long)uVar14) {
                uVar10 = uVar14;
              }
              uVar23 = 1;
              if (9 < uVar10) {
                uVar15 = uVar10;
                uVar12 = 4;
                do {
                  uVar23 = uVar12;
                  if (uVar15 < 100) {
                    uVar23 = uVar23 - 2;
                    goto LAB_00139aa1;
                  }
                  if (uVar15 < 1000) {
                    uVar23 = uVar23 - 1;
                    goto LAB_00139aa1;
                  }
                  if (uVar15 < 10000) goto LAB_00139aa1;
                  bVar6 = 99999 < uVar15;
                  uVar15 = uVar15 / 10000;
                  uVar12 = uVar23 + 4;
                } while (bVar6);
                uVar23 = uVar23 + 1;
              }
LAB_00139aa1:
              local_e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_e8,(char)uVar23 - (char)((long)uVar14 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_e8._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar23,uVar10);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != paVar1) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              snprintf((char *)&local_e8,0x11,"%016llx",(pVVar20->value).i64);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              pVVar19 = local_38;
              break;
            case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_UINT64_KHR:
              uVar14 = (pVVar20->value).u64;
              cVar17 = '\x01';
              if (9 < uVar14) {
                uVar10 = uVar14;
                cVar5 = '\x04';
                do {
                  cVar17 = cVar5;
                  if (uVar10 < 100) {
                    cVar17 = cVar17 + -2;
                    goto LAB_001399b8;
                  }
                  if (uVar10 < 1000) {
                    cVar17 = cVar17 + -1;
                    goto LAB_001399b8;
                  }
                  if (uVar10 < 10000) goto LAB_001399b8;
                  bVar6 = 99999 < uVar10;
                  uVar10 = uVar10 / 10000;
                  cVar5 = cVar17 + '\x04';
                } while (bVar6);
                cVar17 = cVar17 + '\x01';
              }
LAB_001399b8:
              local_e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_e8,cVar17);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_e8._M_dataplus._M_p,(uint)local_e8._M_string_length,uVar14);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != paVar1) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              snprintf((char *)&local_e8,0x11,"%016llx",(pVVar20->value).i64);
            default:
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              break;
            case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_FLOAT64_KHR:
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        (&local_e8,vsnprintf,0x148,"%f",(pVVar20->value).b32);
LAB_00139a6c:
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != paVar1) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pVVar20 = pVVar20 + 1;
          } while (pVVar20 != pVVar19);
        }
        if (local_88.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_start != (VkPipelineExecutableStatisticKHR *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a8.
            super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (VkPipelineExecutableInternalRepresentationKHR *)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto joined_r0x0013957a;
      }
    }
LAB_00139b99:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"// Could not find stage in compiled pipeline.","");
  }
  else {
    if (device->amd_shader_info != true) goto LAB_0013958a;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    VVar8 = (*vkGetShaderInfoAMD)
                      (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                       (size_t *)&local_e8,(void *)0x0);
    if (VVar8 != VK_SUCCESS) {
      disassemble_spirv_abi_cxx11_();
      return __return_storage_ptr__;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_c8,(size_type)local_e8._M_dataplus._M_p,
               (allocator_type *)&local_58);
    VVar8 = (*vkGetShaderInfoAMD)
                      (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                       (size_t *)&local_e8,(void *)local_c8._0_8_);
    if (VVar8 == VK_SUCCESS) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)__return_storage_ptr__,local_c8._0_8_,local_c8._8_8_);
      local_70.
      super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
      local_70.
      super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._0_8_;
    }
    else {
      disassemble_spirv_abi_cxx11_();
      local_70.
      super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
      local_70.
      super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._0_8_;
    }
  }
joined_r0x0013957a:
  if (local_70.
      super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ._M_impl.super__Vector_impl_data._M_start == (VkPipelineExecutablePropertiesKHR *)0x0) {
    return __return_storage_ptr__;
  }
  pVVar18 = (VkPipeline)
            ((long)local_70.
                   super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)local_70.
                  super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start);
LAB_00139bd2:
  operator_delete(local_70.
                  super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start,(ulong)pVVar18);
  return __return_storage_ptr__;
}

Assistant:

static string disassemble_spirv(const VulkanDevice &device, VkPipeline pipeline,
                                DisasmMethod method, VkShaderStageFlagBits stage,
                                const VkShaderModuleCreateInfo *module_create_info, const char *entry_point)
{
	switch (method)
	{
	case DisasmMethod::Asm:
		return disassemble_spirv_asm(module_create_info);

	case DisasmMethod::GLSL:
		return disassemble_spirv_glsl(module_create_info, entry_point, stage);

	case DisasmMethod::ISA:
		return disassemble_spirv_isa(device, pipeline, stage);

	default:
		return "";
	}
}